

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.cc
# Opt level: O0

btree_result btree_remove(btree *btree,void *key)

{
  undefined2 uVar1;
  uint16_t uVar2;
  btree_print_func *pbVar3;
  code *pcVar4;
  undefined8 uVar5;
  short sVar6;
  void *pvVar7;
  void *btree_00;
  idx_t iVar8;
  int iVar9;
  uint8_t *puVar10;
  uint8_t *puVar11;
  idx_t *piVar12;
  bid_t *pbVar13;
  bid_t bVar14;
  int8_t *piVar15;
  int8_t *piVar16;
  idx_t *piVar17;
  bnode **ppbVar18;
  undefined8 *puVar19;
  uint8_t *puVar20;
  bnode *pbVar21;
  undefined8 uVar22;
  ulong uVar23;
  long lVar24;
  undefined8 uStack_100;
  bnode *apbStack_f8 [2];
  undefined2 local_e2;
  uint8_t *local_e0;
  code *local_d8;
  metasize_t local_d0;
  btree_meta meta;
  bnode *child;
  bnode *new_root;
  bid_t new_root_bid;
  bid_t child_bid;
  uint32_t new_rootsize;
  uint32_t nodesize;
  uint8_t *buf;
  undefined1 *puStack_88;
  int i;
  bnode **node;
  idx_t *idx_rmv;
  int8_t *rmv;
  int8_t *moved;
  int8_t *modified;
  bid_t _bid;
  bid_t *bid;
  idx_t *idx;
  uint8_t *vv;
  uint8_t *kk;
  uint8_t *v;
  uint8_t *k;
  void *addr;
  void *key_local;
  btree *btree_local;
  
  puVar20 = (uint8_t *)((long)apbStack_f8 - (ulong)(btree->ksize + 0xf & 0xfffffff0));
  puVar10 = puVar20 + -(ulong)(btree->vsize + 0xf & 0xfffffff0);
  puVar11 = puVar10 + -(ulong)(btree->ksize + 0xf & 0xfffffff0);
  piVar12 = (idx_t *)(puVar11 + -(ulong)(btree->vsize + 0xf & 0xfffffff0));
  pbVar13 = (bid_t *)((long)piVar12 -
                     (ulong)(btree->height + 0xf + (uint)btree->height & 0xfffffff0));
  bVar14 = (long)pbVar13 - (ulong)((uint)btree->height * 8 + 0xf & 0xfffffff0);
  piVar15 = (int8_t *)(bVar14 - (btree->height + 0xf & 0xfffffff0));
  piVar16 = piVar15 + -(ulong)(btree->height + 0xf & 0xfffffff0);
  piVar17 = (idx_t *)(piVar16 + -(ulong)(btree->height + 0xf & 0xfffffff0));
  ppbVar18 = (bnode **)
             ((long)piVar17 - (ulong)(btree->height + 0xf + (uint)btree->height & 0xfffffff0));
  puVar19 = (undefined8 *)((long)ppbVar18 - (ulong)((uint)btree->height * 8 + 0xf & 0xfffffff0));
  for (buf._4_4_ = 0; (int)buf._4_4_ < (int)(uint)btree->height; buf._4_4_ = buf._4_4_ + 1) {
    *(undefined1 *)((long)piVar17 + (long)(int)buf._4_4_) = 0;
    piVar15[(int)buf._4_4_] = '\0';
    piVar16[(int)buf._4_4_] = '\0';
  }
  puStack_88 = (undefined1 *)puVar19;
  node = ppbVar18;
  idx_rmv = piVar17;
  rmv = piVar16;
  moved = piVar15;
  _bid = bVar14;
  bid = pbVar13;
  idx = piVar12;
  vv = puVar11;
  kk = puVar10;
  v = puVar20;
  addr = key;
  key_local = btree;
  if (btree->kv_ops->init_kv_var != (btree_print_func *)0x0) {
    pbVar3 = btree->kv_ops->init_kv_var;
    *(undefined8 *)((long)puVar19 + -8) = 0x1101a5;
    (*pbVar3)(btree,puVar20,puVar10);
    pvVar7 = key_local;
    puVar20 = vv;
    piVar12 = idx;
    pcVar4 = *(code **)(*(long *)((long)key_local + 0x20) + 0x30);
    *(undefined8 *)((long)puVar19 + -8) = 0x1101bf;
    (*pcVar4)(pvVar7,puVar20,piVar12);
  }
  *(undefined1 *)idx_rmv = 1;
  *(undefined8 *)(_bid + (long)(int)(*(ushort *)((long)key_local + 2) - 1) * 8) =
       *(undefined8 *)((long)key_local + 8);
  buf._4_4_ = (uint)*(ushort *)((long)key_local + 2);
  while( true ) {
    buf._4_4_ = buf._4_4_ - 1;
    if ((int)buf._4_4_ < 0) {
      for (buf._4_4_ = 0; puVar10 = v, puVar20 = kk,
          (int)buf._4_4_ < (int)(uint)*(ushort *)((long)key_local + 2); buf._4_4_ = buf._4_4_ + 1) {
        if (0 < (int)buf._4_4_) {
          pcVar4 = (code *)**(undefined8 **)((long)key_local + 0x20);
          uVar22 = *(undefined8 *)(puStack_88 + (long)(int)buf._4_4_ * 8);
          uVar1 = *(undefined2 *)((long)bid + (long)(int)buf._4_4_ * 2);
          puVar19[-1] = 0x110524;
          (*pcVar4)(uVar22,uVar1,puVar10,puVar20);
          puVar20 = vv;
          piVar12 = idx;
          if (*(short *)(*(long *)(puStack_88 + (long)(int)(buf._4_4_ + -1) * 8) + 6) != 0) {
            pcVar4 = (code *)**(undefined8 **)((long)key_local + 0x20);
            uVar22 = *(undefined8 *)(puStack_88 + (long)(int)(buf._4_4_ + -1) * 8);
            puVar19[-1] = 0x110570;
            (*pcVar4)(uVar22,0,puVar20,piVar12);
            puVar10 = v;
            puVar20 = vv;
            pcVar4 = *(code **)(*(long *)((long)key_local + 0x20) + 0x60);
            uVar22 = *(undefined8 *)((long)key_local + 0x30);
            puVar19[-1] = 0x11058e;
            iVar9 = (*pcVar4)(puVar20,puVar10,uVar22);
            puVar10 = kk;
            puVar20 = vv;
            if (iVar9 != 0) {
              pcVar4 = *(code **)(*(long *)((long)key_local + 0x20) + 8);
              uVar22 = *(undefined8 *)(puStack_88 + (long)(int)buf._4_4_ * 8);
              uVar1 = *(undefined2 *)((long)bid + (long)(int)buf._4_4_ * 2);
              puVar19[-1] = 0x1105ca;
              (*pcVar4)(uVar22,uVar1,puVar20,puVar10);
              pvVar7 = key_local;
              puVar10 = v;
              puVar20 = vv;
              pcVar4 = *(code **)(*(long *)((long)key_local + 0x20) + 0x40);
              puVar19[-1] = 0x1105e4;
              (*pcVar4)(pvVar7,puVar10,puVar20);
              moved[(int)buf._4_4_] = '\x01';
            }
          }
          if (rmv[(int)(buf._4_4_ + -1)] != '\0') {
            modified = (int8_t *)
                       (*(ulong *)(_bid + (long)(int)(buf._4_4_ + -1) * 8) >> 0x38 |
                        (*(ulong *)(_bid + (long)(int)(buf._4_4_ + -1) * 8) & 0xff000000000000) >>
                        0x28 | (*(ulong *)(_bid + (long)(int)(buf._4_4_ + -1) * 8) & 0xff0000000000)
                               >> 0x18 |
                        (*(ulong *)(_bid + (long)(int)(buf._4_4_ + -1) * 8) & 0xff00000000) >> 8 |
                        (*(ulong *)(_bid + (long)(int)(buf._4_4_ + -1) * 8) & 0xff000000) << 8 |
                        (*(ulong *)(_bid + (long)(int)(buf._4_4_ + -1) * 8) & 0xff0000) << 0x18 |
                        (*(ulong *)(_bid + (long)(int)(buf._4_4_ + -1) * 8) & 0xff00) << 0x28 |
                       *(long *)(_bid + (long)(int)(buf._4_4_ + -1) * 8) << 0x38);
            local_d8 = *(code **)(*(long *)((long)key_local + 0x20) + 8);
            apbStack_f8[1] = *(bnode **)(puStack_88 + (long)(int)buf._4_4_ * 8);
            local_e2 = *(undefined2 *)((long)bid + (long)(int)buf._4_4_ * 2);
            local_e0 = v;
            pcVar4 = *(code **)(*(long *)((long)key_local + 0x20) + 0x70);
            puVar19[-1] = 0x110788;
            uVar22 = (*pcVar4)(&modified);
            pcVar4 = local_d8;
            puVar20 = local_e0;
            uVar1 = local_e2;
            pbVar21 = apbStack_f8[1];
            puVar19[-1] = 0x1107ac;
            (*pcVar4)(pbVar21,uVar1,puVar20,uVar22);
            moved[(int)buf._4_4_] = '\x01';
          }
        }
        puVar10 = v;
        puVar20 = kk;
        if (*(char *)((long)idx_rmv + (long)(int)buf._4_4_) != '\0') {
          pcVar4 = (code *)**(undefined8 **)((long)key_local + 0x20);
          uVar22 = *(undefined8 *)(puStack_88 + (long)(int)buf._4_4_ * 8);
          uVar1 = *(undefined2 *)((long)bid + (long)(int)buf._4_4_ * 2);
          puVar19[-1] = 0x110808;
          (*pcVar4)(uVar22,uVar1,puVar10,puVar20);
          puVar19[-1] = 0x110824;
          iVar8 = _btree_remove_entry((btree *)puVar19[2],(bnode *)puVar19[1],(void *)*puVar19);
          *(idx_t *)((long)node + (long)(int)buf._4_4_ * 2) = iVar8;
          moved[(int)buf._4_4_] = '\x01';
          if ((((*(short *)(*(long *)(puStack_88 + (long)(int)buf._4_4_ * 8) + 6) == 0) &&
               ((int)(buf._4_4_ + 1) < (int)(uint)*(ushort *)((long)key_local + 2))) ||
              ((*(ushort *)(*(long *)(puStack_88 + (long)(int)buf._4_4_ * 8) + 6) < 2 &&
               (buf._4_4_ + 1 == (uint)*(ushort *)((long)key_local + 2))))) &&
             (1 < *(ushort *)((long)key_local + 2))) {
            pcVar4 = *(code **)(*(long *)((long)key_local + 0x18) + 0x28);
            uVar22 = *(undefined8 *)((long)key_local + 0x10);
            uVar5 = *(undefined8 *)(_bid + (long)(int)buf._4_4_ * 8);
            puVar19[-1] = 0x1108dd;
            (*pcVar4)(uVar22,uVar5);
            puVar10 = v;
            puVar20 = kk;
            if ((int)(buf._4_4_ + 1) < (int)(uint)*(ushort *)((long)key_local + 2)) {
              *(undefined1 *)((long)idx_rmv + (long)(int)(buf._4_4_ + 1)) = 1;
            }
            else {
              puVar19 = (undefined8 *)
                        ((long)puVar19 -
                        ((ulong)*(uint *)((long)key_local + 4) + 0xf & 0xfffffffffffffff0));
              child_bid._4_4_ = 0;
              child_bid._0_4_ = 0;
              pcVar4 = (code *)**(undefined8 **)((long)key_local + 0x20);
              uVar22 = *(undefined8 *)(puStack_88 + (long)(int)buf._4_4_ * 8);
              _new_rootsize = (undefined1 *)puVar19;
              *(undefined8 *)((long)puVar19 + -8) = 0x110966;
              (*pcVar4)(uVar22,0,puVar10,puVar20);
              puVar20 = kk;
              pcVar4 = *(code **)(*(long *)((long)key_local + 0x20) + 0x68);
              *(undefined8 *)((long)puVar19 + -8) = 0x110978;
              uVar23 = (*pcVar4)(puVar20);
              uVar23 = uVar23 >> 0x38 | (uVar23 & 0xff000000000000) >> 0x28 |
                       (uVar23 & 0xff0000000000) >> 0x18 | (uVar23 & 0xff00000000) >> 8 |
                       (uVar23 & 0xff000000) << 8 | (uVar23 & 0xff0000) << 0x18 |
                       (uVar23 & 0xff00) << 0x28 | uVar23 << 0x38;
              pcVar4 = *(code **)(*(long *)((long)key_local + 0x18) + 0x18);
              uVar22 = *(undefined8 *)((long)key_local + 0x10);
              new_root_bid = uVar23;
              *(undefined8 *)((long)puVar19 + -8) = 0x110a57;
              puVar20 = (uint8_t *)(*pcVar4)(uVar22,uVar23);
              pvVar7 = key_local;
              uVar2 = *(uint16_t *)((long)key_local + 2);
              k = puVar20;
              *(undefined8 *)((long)puVar19 + -8) = 0x110a70;
              meta.data = _fetch_bnode((btree *)pvVar7,puVar20,uVar2);
              bVar14 = new_root_bid;
              pcVar4 = *(code **)(*(long *)((long)key_local + 0x18) + 0x38);
              uVar22 = *(undefined8 *)((long)key_local + 0x10);
              *(undefined8 *)((long)puVar19 + -8) = 0x110a94;
              iVar9 = (*pcVar4)(uVar22,bVar14);
              child_bid._4_4_ = iVar9 - 1;
              *(undefined8 *)((long)puVar19 + -8) = 0x110ab9;
              local_d0 = btree_read_meta(*(btree **)((long)puVar19 + 0x28),
                                         *(void **)((long)puVar19 + 0x20));
              pvVar7 = meta.data;
              meta._0_8_ = _new_rootsize;
              if (local_d0 != 0) {
                child_bid._0_4_ = (uint)child_bid + (local_d0 + 0x11 & 0xfffffff0);
              }
              pcVar4 = *(code **)(*(long *)((long)key_local + 0x20) + 0x20);
              *(undefined8 *)((long)puVar19 + -8) = 0x110b2b;
              iVar9 = (*pcVar4)(pvVar7,0,0,0);
              child_bid._0_4_ = (uint)child_bid + iVar9 + 0x10;
              if ((uint)child_bid < child_bid._4_4_) {
                *(short *)((long)key_local + 2) = *(short *)((long)key_local + 2) + -1;
                pcVar4 = (code *)**(undefined8 **)((long)key_local + 0x18);
                uVar22 = *(undefined8 *)((long)key_local + 0x10);
                *(undefined8 *)((long)puVar19 + -8) = 0x110b8b;
                k = (uint8_t *)(*pcVar4)(uVar22,&new_root);
                *(undefined8 *)((long)puVar19 + -8) = 0x110bbe;
                _btree_init_node(*(btree **)((long)puVar19 + 0x38),*(bid_t *)((long)puVar19 + 0x30),
                                 *(void **)((long)puVar19 + 0x28),
                                 *(bnode_flag_t *)((long)puVar19 + 0x26),
                                 *(uint16_t *)((long)puVar19 + 0x24),
                                 *(btree_meta **)((long)puVar19 + 0x18));
                pvVar7 = key_local;
                puVar20 = k;
                uVar2 = *(uint16_t *)((long)key_local + 2);
                *(undefined8 *)((long)puVar19 + -8) = 0x110bd3;
                pbVar21 = _fetch_bnode((btree *)pvVar7,puVar20,uVar2);
                pvVar7 = meta.data;
                pcVar4 = *(code **)(*(long *)((long)key_local + 0x20) + 0x18);
                uVar1 = *(undefined2 *)((long)meta.data + 6);
                *(undefined8 *)((long)puVar19 + -8) = 0x110c06;
                (*pcVar4)(pbVar21,pvVar7,0,0,uVar1);
                bVar14 = new_root_bid;
                pbVar21->nentry = *(idx_t *)((long)meta.data + 6);
                pcVar4 = *(code **)(*(long *)((long)key_local + 0x18) + 0x28);
                uVar22 = *(undefined8 *)((long)key_local + 0x10);
                *(undefined8 *)((long)puVar19 + -8) = 0x110c39;
                (*pcVar4)(uVar22,bVar14);
                *(bnode **)((long)key_local + 8) = new_root;
                moved[(int)buf._4_4_] = '\0';
              }
            }
          }
        }
        if (moved[(int)buf._4_4_] != '\0') {
          pcVar4 = *(code **)(*(long *)((long)key_local + 0x18) + 0x30);
          uVar22 = *(undefined8 *)((long)key_local + 0x10);
          uVar5 = *(undefined8 *)(_bid + (long)(int)buf._4_4_ * 8);
          *(undefined8 *)((long)puVar19 + -8) = 0x110c97;
          iVar9 = (*pcVar4)(uVar22,uVar5);
          if (iVar9 == 0) {
            pcVar4 = *(code **)(*(long *)((long)key_local + 0x18) + 0x20);
            uVar22 = *(undefined8 *)((long)key_local + 0x10);
            uVar5 = *(undefined8 *)(_bid + (long)(int)buf._4_4_ * 8);
            lVar24 = _bid + (long)(int)buf._4_4_ * 8;
            *(undefined8 *)((long)puVar19 + -8) = 0x110cd7;
            puVar20 = (uint8_t *)(*pcVar4)(uVar22,uVar5,lVar24);
            pvVar7 = key_local;
            sVar6 = (short)buf._4_4_;
            k = puVar20;
            *(undefined8 *)((long)puVar19 + -8) = 0x110cf4;
            pbVar21 = _fetch_bnode((btree *)pvVar7,puVar20,sVar6 + 1);
            *(bnode **)(puStack_88 + (long)(int)buf._4_4_ * 8) = pbVar21;
            rmv[(int)buf._4_4_] = '\x01';
            if (buf._4_4_ + 1 == (uint)*(ushort *)((long)key_local + 2)) {
              *(undefined8 *)((long)key_local + 8) =
                   *(undefined8 *)(_bid + (long)(int)buf._4_4_ * 8);
            }
          }
          else {
            pcVar4 = *(code **)(*(long *)((long)key_local + 0x18) + 0x40);
            uVar22 = *(undefined8 *)((long)key_local + 0x10);
            uVar5 = *(undefined8 *)(_bid + (long)(int)buf._4_4_ * 8);
            *(undefined8 *)((long)puVar19 + -8) = 0x110d68;
            (*pcVar4)(uVar22,uVar5);
          }
        }
      }
      if (*(long *)(*(long *)((long)key_local + 0x18) + 0x48) != 0) {
        pcVar4 = *(code **)(*(long *)((long)key_local + 0x18) + 0x48);
        uVar22 = *(undefined8 *)((long)key_local + 0x10);
        puVar19[-1] = 0x110da5;
        (*pcVar4)(uVar22);
      }
      pvVar7 = key_local;
      puVar10 = v;
      puVar20 = kk;
      if (*(long *)(*(long *)((long)key_local + 0x20) + 0x38) != 0) {
        pcVar4 = *(code **)(*(long *)((long)key_local + 0x20) + 0x38);
        puVar19[-1] = 0x110dce;
        (*pcVar4)(pvVar7,puVar10,puVar20);
        pvVar7 = key_local;
        puVar20 = vv;
        piVar12 = idx;
        pcVar4 = *(code **)(*(long *)((long)key_local + 0x20) + 0x38);
        puVar19[-1] = 0x110de8;
        (*pcVar4)(pvVar7,puVar20,piVar12);
      }
      return BTREE_RESULT_SUCCESS;
    }
    pcVar4 = *(code **)(*(long *)((long)key_local + 0x18) + 0x18);
    uVar22 = *(undefined8 *)((long)key_local + 0x10);
    uVar5 = *(undefined8 *)(_bid + (long)(int)buf._4_4_ * 8);
    *(undefined8 *)((long)puVar19 + -8) = 0x110227;
    puVar20 = (uint8_t *)(*pcVar4)(uVar22,uVar5);
    pvVar7 = key_local;
    sVar6 = (short)buf._4_4_;
    k = puVar20;
    *(undefined8 *)((long)puVar19 + -8) = 0x110244;
    pbVar21 = _fetch_bnode((btree *)pvVar7,puVar20,sVar6 + 1);
    btree_00 = key_local;
    pvVar7 = addr;
    *(bnode **)(puStack_88 + (long)(int)buf._4_4_ * 8) = pbVar21;
    pbVar21 = *(bnode **)(puStack_88 + (long)(int)buf._4_4_ * 8);
    *(undefined8 *)((long)puVar19 + -8) = 0x110272;
    iVar8 = _btree_find_entry((btree *)btree_00,pbVar21,pvVar7);
    puVar10 = v;
    puVar20 = kk;
    *(idx_t *)((long)bid + (long)(int)buf._4_4_ * 2) = iVar8;
    if (*(short *)((long)bid + (long)(int)buf._4_4_ * 2) == -1) break;
    pcVar4 = (code *)**(undefined8 **)((long)key_local + 0x20);
    uVar22 = *(undefined8 *)(puStack_88 + (long)(int)buf._4_4_ * 8);
    uVar1 = *(undefined2 *)((long)bid + (long)(int)buf._4_4_ * 2);
    *(undefined8 *)((long)puVar19 + -8) = 0x110344;
    (*pcVar4)(uVar22,uVar1,puVar10,puVar20);
    puVar20 = kk;
    if (0 < (int)buf._4_4_) {
      pcVar4 = *(code **)(*(long *)((long)key_local + 0x20) + 0x68);
      *(undefined8 *)((long)puVar19 + -8) = 0x110363;
      uVar22 = (*pcVar4)(puVar20);
      *(undefined8 *)(_bid + (long)(int)(buf._4_4_ - 1) * 8) = uVar22;
      *(ulong *)(_bid + (long)(int)(buf._4_4_ - 1) * 8) =
           *(ulong *)(_bid + (long)(int)(buf._4_4_ - 1) * 8) >> 0x38 |
           (*(ulong *)(_bid + (long)(int)(buf._4_4_ - 1) * 8) & 0xff000000000000) >> 0x28 |
           (*(ulong *)(_bid + (long)(int)(buf._4_4_ - 1) * 8) & 0xff0000000000) >> 0x18 |
           (*(ulong *)(_bid + (long)(int)(buf._4_4_ - 1) * 8) & 0xff00000000) >> 8 |
           (*(ulong *)(_bid + (long)(int)(buf._4_4_ - 1) * 8) & 0xff000000) << 8 |
           (*(ulong *)(_bid + (long)(int)(buf._4_4_ - 1) * 8) & 0xff0000) << 0x18 |
           (*(ulong *)(_bid + (long)(int)(buf._4_4_ - 1) * 8) & 0xff00) << 0x28 |
           *(long *)(_bid + (long)(int)(buf._4_4_ - 1) * 8) << 0x38;
    }
  }
  if (*(long *)(*(long *)((long)key_local + 0x18) + 0x48) != 0) {
    pcVar4 = *(code **)(*(long *)((long)key_local + 0x18) + 0x48);
    uVar22 = *(undefined8 *)((long)key_local + 0x10);
    *(undefined8 *)((long)puVar19 + -8) = 0x1102bf;
    (*pcVar4)(uVar22);
  }
  pvVar7 = key_local;
  puVar10 = v;
  puVar20 = kk;
  if (*(long *)(*(long *)((long)key_local + 0x20) + 0x38) != 0) {
    pcVar4 = *(code **)(*(long *)((long)key_local + 0x20) + 0x38);
    *(undefined8 *)((long)puVar19 + -8) = 0x1102e8;
    (*pcVar4)(pvVar7,puVar10,puVar20);
    pvVar7 = key_local;
    puVar20 = vv;
    piVar12 = idx;
    pcVar4 = *(code **)(*(long *)((long)key_local + 0x20) + 0x38);
    *(undefined8 *)((long)puVar19 + -8) = 0x110302;
    (*pcVar4)(pvVar7,puVar20,piVar12);
  }
  return BTREE_RESULT_FAIL;
}

Assistant:

btree_result btree_remove(struct btree *btree, void *key)
{
    void *addr;
    uint8_t *k = alca(uint8_t, btree->ksize);
    uint8_t *v= alca(uint8_t, btree->vsize);
    uint8_t *kk = alca(uint8_t, btree->ksize);
    uint8_t *vv = alca(uint8_t, btree->vsize);
    // index# and block ID for each level
    idx_t *idx = alca(idx_t, btree->height);
    bid_t *bid= alca(bid_t, btree->height);
    bid_t _bid;
    // flags
    int8_t *modified = alca(int8_t, btree->height);
    int8_t *moved = alca(int8_t, btree->height);
    int8_t *rmv = alca(int8_t, btree->height);
    // index# of removed key
    idx_t *idx_rmv = alca(idx_t, btree->height);
    struct bnode **node = alca(struct bnode *, btree->height);
    int i;

    // initialize flags
    for (i=0;i<btree->height;++i) {
        moved[i] = modified[i] = rmv[i] = 0;
    }
    if (btree->kv_ops->init_kv_var) {
        btree->kv_ops->init_kv_var(btree, k, v);
        btree->kv_ops->init_kv_var(btree, kk, vv);
    }

    rmv[0] = 1;

    // set root
    bid[btree->height-1] = btree->root_bid;

    // find path from root to leaf
    for (i=btree->height-1; i>=0; --i) {
        // read block using bid
        addr = btree->blk_ops->blk_read(btree->blk_handle, bid[i]);
        // fetch node structure from block
        node[i] = _fetch_bnode(btree, addr, i+1);

        // lookup key in current node
        idx[i] = _btree_find_entry(btree, node[i], key);

        if (idx[i] == BTREE_IDX_NOT_FOUND) {
            // not found
            if (btree->blk_ops->blk_operation_end)
                btree->blk_ops->blk_operation_end(btree->blk_handle);
            if (btree->kv_ops->free_kv_var) {
                btree->kv_ops->free_kv_var(btree, k, v);
                btree->kv_ops->free_kv_var(btree, kk, vv);
            }
            return BTREE_RESULT_FAIL;
        }

        btree->kv_ops->get_kv(node[i], idx[i], k, v);

        if (i>0) {
            // index (non-leaf) node
            // get bid of child node from value
            bid[i-1] = btree->kv_ops->value2bid(v);
            bid[i-1] = _endian_decode(bid[i-1]);
        }else{
            // leaf node
        }
    }

    // cascaded remove from leaf to root
    for (i=0;i<btree->height;++i){
        // in case of index node
        if (i > 0) {
            btree->kv_ops->get_kv(node[i], idx[i], k, v);

            // when child node's smallest key is changed due to remove
              if (node[i-1]->nentry > 0) {
                btree->kv_ops->get_kv(node[i-1], 0, kk, vv);
                if (btree->kv_ops->cmp(kk, k, btree->aux)) {
                    // change current node's corresponding key
                    btree->kv_ops->set_kv(node[i], idx[i], kk, v);
                    //memcpy(k, kk, btree->ksize);
                    btree->kv_ops->set_key(btree, k, kk);
                    modified[i] = 1;
                }
            }

            // when child node is moved to new block
            if (moved[i-1]) {
                // replace the bid (value)
                _bid = _endian_encode(bid[i-1]);
                btree->kv_ops->set_kv(node[i], idx[i], k,
                                      btree->kv_ops->bid2value(&_bid));
                modified[i] = 1;
            }
        }

        if (rmv[i]) {
            // there is a key-value pair to be removed
            btree->kv_ops->get_kv(node[i], idx[i], k, v);
            idx_rmv[i] = _btree_remove_entry(btree, node[i], k);
            modified[i] = 1;

            /*
            remove the node when
            1. non-root node has no kv-pair or
            2. root node has less or equal than one kv-pair
            */
            if (((node[i]->nentry < 1 && i+1 < btree->height) ||
                (node[i]->nentry <= 1 && i+1 == btree->height)) &&
                btree->height > 1) {
                // remove the node
                btree->blk_ops->blk_remove(btree->blk_handle, bid[i]);
                if (i+1 < btree->height) {
                    // if non-root node
                    rmv[i+1] = 1;
                } else {
                    // if root node, shrink the height

                    // allocate new block for new root node
                    uint8_t *buf = alca(uint8_t, btree->blksize);
                    uint32_t nodesize = 0, new_rootsize = 0;
                    bid_t child_bid, new_root_bid;
                    struct bnode *new_root, *child;
                    struct btree_meta meta;

                    // read the child node
                    btree->kv_ops->get_kv(node[i], 0, k, v);
                    child_bid = btree->kv_ops->value2bid(v);
                    child_bid = _endian_decode(child_bid);
                    addr = btree->blk_ops->blk_read(btree->blk_handle, child_bid);
                    child = _fetch_bnode(btree, addr, btree->height);

                    nodesize = btree->blk_ops->blk_get_size(btree->blk_handle, child_bid);
#ifdef __CRC32
                    nodesize -= BLK_MARKER_SIZE;
#endif

                    // estimate the new root node size including metadata
                    meta.size = btree_read_meta(btree, buf);
                    meta.data = buf;

                    if (meta.size) {
                        new_rootsize += _metasize_align(meta.size) + sizeof(metasize_t);
                    }
                    new_rootsize += btree->kv_ops->get_data_size(child, NULL, NULL, NULL, 0);
                    new_rootsize += sizeof(struct bnode);

                    if (new_rootsize < nodesize) {
                        // new root node has enough space for metadata .. shrink height
                        btree->height--;

                        // allocate a new node with the given meta
                        addr = btree->blk_ops->blk_alloc(btree->blk_handle,
                                                         &new_root_bid);
                        _btree_init_node(btree, new_root_bid, addr,
                                         btree->root_flag, btree->height, &meta);
                        new_root = _fetch_bnode(btree, addr, btree->height);

                        // copy all entries
                        btree->kv_ops->copy_kv(new_root, child, 0, 0, child->nentry);
                        new_root->nentry = child->nentry;
                        // invalidate chlid node
                        btree->blk_ops->blk_remove(btree->blk_handle, child_bid);

                        btree->root_bid = new_root_bid;

                        // as the old node is invalidated,
                        // we don't need to move it.
                        modified[i] = 0;
                    }
                }
            }
        }

        if (modified[i]) {
            // when node is modified
            if (!btree->blk_ops->blk_is_writable(btree->blk_handle, bid[i])) {
                // already flushed block -> cannot overwrite, so
                // we have to move to new block
                // get new bid[i]
                addr = btree->blk_ops->blk_move(btree->blk_handle, bid[i],
                                                &bid[i]);
                node[i] = _fetch_bnode(btree, addr, i+1);
                moved[i] = 1;

                if (i+1 == btree->height)
                    // if moved node is root node
                    btree->root_bid = bid[i];

            }else{
                btree->blk_ops->blk_set_dirty(btree->blk_handle, bid[i]);
            }

        }
    }

    if (btree->blk_ops->blk_operation_end) {
        btree->blk_ops->blk_operation_end(btree->blk_handle);
    }
    if (btree->kv_ops->free_kv_var) {
        btree->kv_ops->free_kv_var(btree, k, v);
        btree->kv_ops->free_kv_var(btree, kk, vv);
    }
    return BTREE_RESULT_SUCCESS;
}